

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makewff.c
# Opt level: O3

void generate_wff(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int cl [1000];
  uint local_fd8 [1002];
  
  if (style == 2) {
    printf("%d %d\n",(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  else if (style == 0) {
    printf("c seed= %u\np cnf %d %d\n",(ulong)seed,(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  if (0 < nclauses) {
    iVar2 = 1;
    do {
      if (clen < 1) {
        bVar1 = false;
        uVar6 = 0;
      }
      else {
        lVar5 = 0;
LAB_001013a4:
        do {
          lVar3 = random();
          uVar4 = (int)(lVar3 % (long)nvars) + 1;
          if (lVar5 != 0) {
            lVar3 = 0;
            bVar1 = false;
            do {
              if (uVar4 == local_fd8[lVar3]) {
                bVar1 = true;
              }
              lVar3 = lVar3 + 1;
            } while (lVar5 != lVar3);
            if (bVar1) goto LAB_001013a4;
          }
          local_fd8[lVar5] = uVar4;
          lVar5 = lVar5 + 1;
        } while (lVar5 < clen);
        if (clen < 1) {
          bVar1 = false;
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          do {
            lVar5 = random();
            if (499 < lVar5 % 1000) {
              local_fd8[uVar6] = -local_fd8[uVar6];
            }
            uVar6 = uVar6 + 1;
          } while ((long)uVar6 < (long)clen);
          bVar1 = 0 < clen;
        }
      }
      if (style == 2) {
        printf("%d",uVar6 & 0xffffffff);
        if (0 < clen) {
          lVar5 = 0;
          do {
            printf(" %d",(ulong)local_fd8[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 < clen);
        }
LAB_0010150c:
        putchar(10);
      }
      else {
        if (style == 1) {
          printf("%d",(ulong)local_fd8[0]);
          if (1 < clen) {
            lVar5 = 1;
            do {
              printf(" %d",(ulong)local_fd8[lVar5]);
              lVar5 = lVar5 + 1;
            } while (lVar5 < clen);
          }
          goto LAB_0010150c;
        }
        if (style == 0) {
          if (bVar1) {
            lVar5 = 0;
            do {
              printf("%d ",(ulong)local_fd8[lVar5]);
              lVar5 = lVar5 + 1;
            } while (lVar5 < clen);
          }
          puts("0");
        }
      }
      bVar1 = iVar2 < nclauses;
      iVar2 = iVar2 + 1;
    } while (bVar1);
  }
  if (style != 1) {
    return;
  }
  printf("%%\n0\n");
  return;
}

Assistant:

void generate_wff()
{
    int i, j, k;
    int cl[MAX_CLEN];
    int lit;
    int dup;

    if (style == CNF_style) {
        printf("c seed= %u\np cnf %d %d\n", seed, nvars, nclauses);
    } else if (style == KF_style) {
        printf("%d %d\n", nvars, nclauses);
    }

    for (i = 1; i <= nclauses; i++) {
        for (j = 0; j < clen; j++) {
            do {
                lit = random() % nvars + 1;
                dup = FALSE;
                for (k = 0; k < j; k++)
                    if (lit == cl[k])
                        dup = TRUE;
            } while (dup);
            cl[j] = lit;
        }
        for (j = 0; j < clen; j++)
            if (flip())
                cl[j] *= -1;

        if (style == CNF_style) {
            for (j = 0; j < clen; j++)
                printf("%d ", cl[j]);
            printf("0\n");
        } else if (style == F_style) {
            printf("%d", cl[0]);
            for (j = 1; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        } else if (style == KF_style) {
            printf("%d", j);
            for (j = 0; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        }
    }

    if (style == F_style) {
        printf("%%\n0\n");
    }
}